

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

char * parse_object(cJSON *item,char *value,char **ep)

{
  char cVar1;
  cJSON *item_00;
  char *pcVar2;
  cJSON *item_01;
  char *pcVar3;
  
  if (*value == '{') {
    item->type = 0x40;
    pcVar2 = value + 1;
    do {
      pcVar3 = pcVar2;
      pcVar2 = pcVar3 + 1;
    } while ((byte)(*pcVar3 - 1U) < 0x20);
    if (*pcVar3 == '}') {
      return pcVar3 + 1;
    }
    item_00 = (cJSON *)(*cJSON_malloc)(0x40);
    if (item_00 == (cJSON *)0x0) {
      item->child = (cJSON *)0x0;
    }
    else {
      pcVar3 = pcVar3 + -1;
      item_00->valuedouble = 0.0;
      item_00->string = (char *)0x0;
      item_00->valuestring = (char *)0x0;
      *(undefined8 *)&item_00->valueint = 0;
      item_00->child = (cJSON *)0x0;
      *(undefined8 *)&item_00->type = 0;
      item_00->next = (cJSON *)0x0;
      item_00->prev = (cJSON *)0x0;
      item->child = item_00;
      do {
        pcVar2 = pcVar3 + 1;
        pcVar3 = pcVar3 + 1;
      } while ((byte)(*pcVar2 - 1U) < 0x20);
      pcVar2 = parse_string(item_00,pcVar3,ep);
      if (pcVar2 != (char *)0x0) {
        pcVar2 = pcVar2 + -1;
        do {
          pcVar3 = pcVar2 + 1;
          pcVar2 = pcVar2 + 1;
        } while ((byte)(*pcVar3 - 1U) < 0x20);
        item_00->string = item_00->valuestring;
        item_00->valuestring = (char *)0x0;
        if (*pcVar2 == ':') {
          do {
            pcVar3 = pcVar2 + 1;
            pcVar2 = pcVar2 + 1;
          } while ((byte)(*pcVar3 - 1U) < 0x20);
          pcVar2 = parse_value(item_00,pcVar2,ep);
          if (pcVar2 != (char *)0x0) {
            pcVar2 = pcVar2 + -1;
            do {
              cVar1 = pcVar2[1];
              pcVar2 = pcVar2 + 1;
            } while ((byte)(cVar1 - 1U) < 0x20);
            while (cVar1 == ',') {
              item_01 = (cJSON *)(*cJSON_malloc)(0x40);
              if (item_01 == (cJSON *)0x0) {
                return (char *)0x0;
              }
              item_01->valuedouble = 0.0;
              item_01->string = (char *)0x0;
              item_01->valuestring = (char *)0x0;
              *(undefined8 *)&item_01->valueint = 0;
              item_01->child = (cJSON *)0x0;
              *(undefined8 *)&item_01->type = 0;
              item_01->next = (cJSON *)0x0;
              item_01->prev = (cJSON *)0x0;
              item_00->next = item_01;
              item_01->prev = item_00;
              do {
                pcVar3 = pcVar2 + 1;
                pcVar2 = pcVar2 + 1;
              } while ((byte)(*pcVar3 - 1U) < 0x20);
              pcVar2 = parse_string(item_01,pcVar2,ep);
              if (pcVar2 == (char *)0x0) {
                return (char *)0x0;
              }
              pcVar2 = pcVar2 + -1;
              do {
                pcVar3 = pcVar2 + 1;
                pcVar2 = pcVar2 + 1;
              } while ((byte)(*pcVar3 - 1U) < 0x20);
              item_01->string = item_01->valuestring;
              item_01->valuestring = (char *)0x0;
              if (*pcVar2 != ':') goto LAB_001083ea;
              do {
                pcVar3 = pcVar2 + 1;
                pcVar2 = pcVar2 + 1;
              } while ((byte)(*pcVar3 - 1U) < 0x20);
              pcVar2 = parse_value(item_01,pcVar2,ep);
              if (pcVar2 == (char *)0x0) {
                return (char *)0x0;
              }
              pcVar2 = pcVar2 + -1;
              do {
                cVar1 = pcVar2[1];
                pcVar2 = pcVar2 + 1;
                item_00 = item_01;
              } while ((byte)(cVar1 - 1U) < 0x20);
            }
            if (cVar1 == '}') {
              return pcVar2 + 1;
            }
            *ep = pcVar2;
          }
        }
        else {
LAB_001083ea:
          *ep = pcVar2;
        }
      }
    }
  }
  else {
    *ep = value;
  }
  return (char *)0x0;
}

Assistant:

static const char *parse_object(cJSON *item,const char *value,const char **ep)
{
	cJSON *child;
	if (*value!='{')	{*ep=value;return 0;}	/* not an object! */
	
	item->type=cJSON_Object;
	value=skip(value+1);
	if (*value=='}') return value+1;	/* empty array. */
	
	item->child=child=cJSON_New_Item();
	if (!item->child) return 0;
	value=skip(parse_string(child,skip(value),ep));
	if (!value) return 0;
	child->string=child->valuestring;child->valuestring=0;
	if (*value!=':') {*ep=value;return 0;}	/* fail! */
	value=skip(parse_value(child,skip(value+1),ep));	/* skip any spacing, get the value. */
	if (!value) return 0;
	
	while (*value==',')
	{
		cJSON *new_item;
		if (!(new_item=cJSON_New_Item()))	return 0; /* memory fail */
		child->next=new_item;new_item->prev=child;child=new_item;
		value=skip(parse_string(child,skip(value+1),ep));
		if (!value) return 0;
		child->string=child->valuestring;child->valuestring=0;
		if (*value!=':') {*ep=value;return 0;}	/* fail! */
		value=skip(parse_value(child,skip(value+1),ep));	/* skip any spacing, get the value. */
		if (!value) return 0;
	}
	
	if (*value=='}') return value+1;	/* end of array */
	*ep=value;return 0;	/* malformed. */
}